

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swift_generator.cc
# Opt level: O0

string * __thiscall
grpc_swift_generator::(anonymous_namespace)::GenerateServerExtensionBody_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Method *method)

{
  byte bVar1;
  allocator<char> local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined4 local_bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator<char> local_71;
  undefined1 local_70 [8];
  string interceptors;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string start;
  Method *method_local;
  
  start.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"    case \"$MethodName$\":\n    ",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,
             "      interceptors: self.interceptors?.make$MethodName$Interceptors() ?? [],\n",
             &local_71);
  std::allocator<char>::~allocator(&local_71);
  bVar1 = (**(code **)(*(long *)start.field_2._8_8_ + 0x78))();
  if ((bVar1 & 1) == 0) {
    bVar1 = (**(code **)(*(long *)start.field_2._8_8_ + 0x88))();
    if ((bVar1 & 1) == 0) {
      bVar1 = (**(code **)(*(long *)start.field_2._8_8_ + 0x80))();
      if ((bVar1 & 1) == 0) {
        bVar1 = (**(code **)(*(long *)start.field_2._8_8_ + 0x90))();
        if ((bVar1 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"",&local_181);
          std::allocator<char>::~allocator(&local_181);
        }
        else {
          std::operator+(&local_180,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_38,
                         "return BidirectionalStreamingServerHandler(\n      context: context,\n      requestDeserializer: GRPCPayloadDeserializer<$Input$>(),\n      responseSerializer: GRPCPayloadSerializer<$Output$>(),\n"
                        );
          std::operator+(&local_160,&local_180,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70);
          std::operator+(__return_storage_ptr__,&local_160,
                         "      observerFactory: self.$MethodName$(context:))\n");
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_180);
        }
      }
      else {
        std::operator+(&local_140,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
                       ,
                       "return ClientStreamingServerHandler(\n      context: context,\n      requestDeserializer: GRPCPayloadDeserializer<$Input$>(),\n      responseSerializer: GRPCPayloadSerializer<$Output$>(),\n"
                      );
        std::operator+(&local_120,&local_140,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                      );
        std::operator+(__return_storage_ptr__,&local_120,
                       "      observerFactory: self.$MethodName$(context:))\n");
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_140);
      }
    }
    else {
      std::operator+(&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                     "return ServerStreamingServerHandler(\n      context: context,\n      requestDeserializer: GRPCPayloadDeserializer<$Input$>(),\n      responseSerializer: GRPCPayloadSerializer<$Output$>(),\n"
                    );
      std::operator+(&local_e0,&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      std::operator+(__return_storage_ptr__,&local_e0,
                     "      userFunction: self.$MethodName$(request:context:))\n");
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
    }
  }
  else {
    std::operator+(&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "return UnaryServerHandler(\n      context: context,\n      requestDeserializer: GRPCPayloadDeserializer<$Input$>(),\n      responseSerializer: GRPCPayloadSerializer<$Output$>(),\n"
                  );
    std::operator+(&local_98,&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    std::operator+(__return_storage_ptr__,&local_98,
                   "      userFunction: self.$MethodName$(request:context:))\n");
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  local_bc = 1;
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

grpc::string GenerateServerExtensionBody(const grpc_generator::Method *method) {
  grpc::string start = "    case \"$MethodName$\":\n    ";
  grpc::string interceptors =
      "      interceptors: self.interceptors?.make$MethodName$Interceptors() "
      "?? [],\n";
  if (method->NoStreaming()) {
    return start +
           "return UnaryServerHandler(\n"
           "      context: context,\n"
           "      requestDeserializer: GRPCPayloadDeserializer<$Input$>(),\n"
           "      responseSerializer: GRPCPayloadSerializer<$Output$>(),\n" +
           interceptors +
           "      userFunction: self.$MethodName$(request:context:))\n";
  }
  if (method->ServerStreaming()) {
    return start +
           "return ServerStreamingServerHandler(\n"
           "      context: context,\n"
           "      requestDeserializer: GRPCPayloadDeserializer<$Input$>(),\n"
           "      responseSerializer: GRPCPayloadSerializer<$Output$>(),\n" +
           interceptors +
           "      userFunction: self.$MethodName$(request:context:))\n";
  }
  if (method->ClientStreaming()) {
    return start +
           "return ClientStreamingServerHandler(\n"
           "      context: context,\n"
           "      requestDeserializer: GRPCPayloadDeserializer<$Input$>(),\n"
           "      responseSerializer: GRPCPayloadSerializer<$Output$>(),\n" +
           interceptors +
           "      observerFactory: self.$MethodName$(context:))\n";
  }
  if (method->BidiStreaming()) {
    return start +
           "return BidirectionalStreamingServerHandler(\n"
           "      context: context,\n"
           "      requestDeserializer: GRPCPayloadDeserializer<$Input$>(),\n"
           "      responseSerializer: GRPCPayloadSerializer<$Output$>(),\n" +
           interceptors +
           "      observerFactory: self.$MethodName$(context:))\n";
  }
  return "";
}